

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> * __thiscall
pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
def<anurbs::Ref<anurbs::Brep>(*)(anurbs::Model&,std::shared_ptr<anurbs::Brep>),pybind11::arg>
          (class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *this,char *name_,
          _func_Ref<anurbs::Brep>_Model_ptr_shared_ptr<anurbs::Brep> **f,arg *extra)

{
  _func_Ref<anurbs::Brep>_Model_ptr_shared_ptr<anurbs::Brep> *f_00;
  _func_Ref<anurbs::Brep>_Model_ptr_shared_ptr<anurbs::Brep> **pp_Var1;
  handle local_a8;
  PyObject *local_a0;
  obj_attr_accessor local_98;
  handle local_68;
  PyObject *local_60;
  handle local_58;
  handle local_50;
  sibling local_48;
  is_method local_40;
  name local_38;
  cpp_function local_30;
  cpp_function cf;
  arg *extra_local;
  _func_Ref<anurbs::Brep>_Model_ptr_shared_ptr<anurbs::Brep> **f_local;
  char *name__local;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *this_local;
  
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)extra;
  pp_Var1 = method_adaptor<anurbs::Model,anurbs::Ref<anurbs::Brep>(*)(anurbs::Model&,std::shared_ptr<anurbs::Brep>)>
                      (f);
  f_00 = *pp_Var1;
  pybind11::name::name(&local_38,name_);
  is_method::is_method(&local_40,(handle *)this);
  local_58.m_ptr = *(PyObject **)this;
  none::none((none *)&local_68);
  local_60 = local_68.m_ptr;
  getattr((pybind11 *)&local_50,local_58,name_,local_68);
  sibling::sibling(&local_48,&local_50);
  cpp_function::
  cpp_function<anurbs::Ref<anurbs::Brep>,anurbs::Model&,std::shared_ptr<anurbs::Brep>,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg>
            (&local_30,f_00,&local_38,&local_40,&local_48,
             (arg *)cf.super_function.super_object.super_handle.m_ptr);
  pybind11::object::~object((object *)&local_50);
  none::~none((none *)&local_68);
  cpp_function::name((cpp_function *)&local_a8);
  local_a0 = local_a8.m_ptr;
  detail::object_api<pybind11::handle>::attr
            (&local_98,(object_api<pybind11::handle> *)this,local_a8);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_98,&local_30);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_98);
  pybind11::object::~object((object *)&local_a8);
  cpp_function::~cpp_function(&local_30);
  return (class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }